

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_output.cpp
# Opt level: O3

bool get_tokens_as_string(Lexer *lexer,string *s)

{
  pointer pTVar1;
  bool bVar2;
  Token *tok;
  pointer tok_00;
  
  std::__cxx11::string::reserve((ulong)s);
  std::__cxx11::string::append((char *)s);
  tok_00 = (lexer->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (lexer->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (tok_00 != pTVar1) {
    bVar2 = true;
    do {
      if (!bVar2) {
        std::__cxx11::string::append((char *)s);
      }
      stringify_token(tok_00);
      std::__cxx11::string::append((char *)s);
      std::__cxx11::string::append((char *)s);
      std::__cxx11::string::append((char *)s);
      if (tok_00->type == TK_EOF) break;
      tok_00 = tok_00 + 1;
      bVar2 = false;
    } while (tok_00 != pTVar1);
  }
  std::__cxx11::string::append((char *)s);
  return true;
}

Assistant:

bool get_tokens_as_string(Lexer & lexer, string & s)
{
  s.reserve(16384);
  s += "\"tokens\":[";

  bool first = true;
  for (Token & tok : lexer.tokens)
  {
    if (!first)
      s += ",";

    stringify_token(tok);
    s += "\n{";
    s += buf;
    s += "}";
    first = false;

    if (tok.type == TK_EOF)
      break;
  }

  s += "]";
  return true;
}